

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Result __thiscall
testing::Action<void_*(unsigned_long)>::Perform
          (Action<void_*(unsigned_long)> *this,ArgumentTuple *args)

{
  bool bVar1;
  int iVar2;
  ActionInterface<void_*(unsigned_long)> *pAVar3;
  undefined4 extraout_var;
  allocator local_39;
  string local_38;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<void_*(unsigned_long)> *this_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)this;
  bVar1 = IsDoDefault(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,&local_39);
  internal::Assert(!bVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]How-to-mock-free-function/3rd-party/gmock-1.7.0/gmock/gmock.h"
                   ,0x4c3,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pAVar3 = internal::linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_>::operator->
                     (&this->impl_);
  iVar2 = (*pAVar3->_vptr_ActionInterface[2])(pAVar3,local_18);
  return (Result)CONCAT44(extraout_var,iVar2);
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }